

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_p2sh_tests.cpp
# Opt level: O2

bool IsStandardTx(CTransaction *tx,string *reason)

{
  bool bVar1;
  long in_FS_OFFSET;
  CFeeRate local_38;
  CFeeRate local_30;
  optional<unsigned_int> local_28;
  optional<unsigned_int> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  local_30.nSatoshisPerK = 3000;
  bVar1 = IsStandardTx(tx,&local_20,true,&local_30,reason);
  if (bVar1) {
    local_28.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_engaged = false;
    local_38.nSatoshisPerK = 3000;
    bVar1 = IsStandardTx(tx,&local_28,false,&local_38,reason);
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool IsStandardTx(const CTransaction& tx, std::string& reason)
{
    return IsStandardTx(tx, std::nullopt, /*permit_bare_multisig=*/true, CFeeRate{DUST_RELAY_TX_FEE}, reason) &&
           IsStandardTx(tx, std::nullopt, /*permit_bare_multisig=*/false, CFeeRate{DUST_RELAY_TX_FEE}, reason);
}